

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O2

IntRangeValueInfo *
IntRangeValueInfo::New
          (JitArenaAllocator *allocator,int32 lowerBound,int32 upperBound,
          bool wasNegativeZeroPreventedByBailout)

{
  IntRangeValueInfo *this;
  IntConstantBounds local_38;
  
  this = (IntRangeValueInfo *)new<Memory::JitArenaAllocator>(0x28,allocator,0x3d6ef4);
  IntConstantBounds::IntConstantBounds(&local_38,lowerBound,upperBound);
  IntRangeValueInfo(this,&local_38,wasNegativeZeroPreventedByBailout,IntRange);
  return this;
}

Assistant:

static IntRangeValueInfo *New(
        JitArenaAllocator *const allocator,
        const int32 lowerBound,
        const int32 upperBound,
        const bool wasNegativeZeroPreventedByBailout)
    {
        return
            JitAnew(
                allocator,
                IntRangeValueInfo,
                IntConstantBounds(lowerBound, upperBound),
                wasNegativeZeroPreventedByBailout);
    }